

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

void anon_unknown.dwarf_98b3::command_started(void *context,llb_buildsystem_command_t *command)

{
  char *ptr;
  llb_data_t name;
  llb_data_t local_28;
  
  ptr = llb_buildsystem_command_get_description(command);
  llb_buildsystem_command_get_name(command,&local_28);
  printf("%s: %.*s -- %s\n","command_started",(ulong)(uint)local_28.length,local_28.data,ptr);
  llb_free(ptr);
  fflush(_stdout);
  return;
}

Assistant:

static void command_started(void* context,
                            llb_buildsystem_command_t* command) {
  char* description = llb_buildsystem_command_get_description(command);
  llb_data_t name;
  llb_buildsystem_command_get_name(command, &name);
  printf("%s: %.*s -- %s\n", __FUNCTION__, (int)name.length, name.data,
         description);
  llb_free(description);
  fflush(stdout);
}